

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comment.h
# Opt level: O2

void __thiscall Comment::~Comment(Comment *this)

{
  std::__cxx11::string::~string((string *)&this->link);
  std::__cxx11::string::~string((string *)&this->fullName);
  std::__cxx11::string::~string((string *)&this->author);
  std::__cxx11::string::~string((string *)&this->body);
  std::__cxx11::string::~string((string *)&this->threadId);
  std::__cxx11::string::~string((string *)&this->parentId);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Comment(const Json& json) {
			id = json["id"].get<std::string>();

			body = replaceHtmlSymbols(json["body"].get<std::string>());
			str::replace_all(body, "\\_", "_");

			author = json["author"].get<std::string>();

			created = json["created"].get<size_t>();

			fullName = json["name"].get<std::string>();

			link = "https://www.reddit.com" + json["permalink"].get<std::string>();

			const std::string parentId_entry = json["parent_id"].get<std::string>();
			parentId = parentId_entry.substr(3); // t1_[...], t3_[...]
			isTopLevelComment = str::starts_with(parentId_entry, "t3_");

			const std::string threadId_entry = json["link_id"].get<std::string>();
			threadId = threadId_entry.substr(3); // t3_[...]
		}